

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseAssignment(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  int iVar3;
  SynBase *pSVar4;
  undefined4 extraout_var;
  SynBase *this;
  SynBase *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 local_34;
  undefined4 extraout_var_00;
  
  pSVar4 = ParseTernaryExpr(ctx);
  if (pSVar4 == (SynBase *)0x0) {
    return (SynBase *)0x0;
  }
  begin = ctx->currentLexeme;
  this = pSVar4;
  switch(begin->type) {
  case lex_set:
    ctx->currentLexeme = begin + 1;
    this_00 = ParseAssignment(ctx);
    if (this_00 == (SynBase *)0x0) {
      anon_unknown.dwarf_169315::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
      this_00 = (SynBase *)CONCAT44(extraout_var,iVar3);
      SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
      this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynBase *)CONCAT44(extraout_var_00,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002159fd;
    SynBase::SynBase(this,0x31,begin,ctx->currentLexeme + -1);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7b58;
    goto LAB_002159e0;
  case lex_addset:
    local_34 = 1;
    break;
  case lex_subset:
    local_34 = 2;
    break;
  case lex_mulset:
    local_34 = 3;
    break;
  case lex_divset:
    local_34 = 4;
    break;
  case lex_powset:
    local_34 = 5;
    break;
  case lex_modset:
    local_34 = 6;
    break;
  case lex_shlset:
    local_34 = 7;
    break;
  case lex_shrset:
    local_34 = 8;
    break;
  case lex_andset:
    local_34 = 9;
    break;
  case lex_orset:
    local_34 = 10;
    break;
  case lex_xorset:
    local_34 = 0xb;
    break;
  default:
    goto switchD_002157f7_default;
  }
  pcVar2 = begin->pos;
  uVar1 = begin->length;
  ctx->currentLexeme = begin + 1;
  this_00 = ParseAssignment(ctx);
  if (this_00 == (SynBase *)0x0) {
    anon_unknown.dwarf_169315::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\' operator",
               (ulong)uVar1,pcVar2);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
    this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar3);
    SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
    this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this = (SynBase *)CONCAT44(extraout_var_02,iVar3);
  if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_002159fd:
    __assert_fail("currentLexeme > firstLexeme",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x19c,"Lexeme *ParseContext::Previous()");
  }
  SynBase::SynBase(this,0x32,begin,ctx->currentLexeme + -1);
  this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7b90;
  *(undefined4 *)&this->field_0x3c = local_34;
LAB_002159e0:
  this[1]._vptr_SynBase = (_func_int **)pSVar4;
  *(SynBase **)&this[1].typeID = this_00;
switchD_002157f7_default:
  return this;
}

Assistant:

SynBase* ParseAssignment(ParseContext &ctx)
{
	if(SynBase *lhs = ParseTernaryExpr(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_set))
		{
			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynAssignment>()) SynAssignment(pos, ctx.Previous(), lhs, rhs);
		}
		else if(SynModifyAssignType modifyType = GetModifyAssignType(ctx.Peek()))
		{
			InplaceStr name = ctx.Consume();

			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s' operator", name.length(), name.begin);

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynModifyAssignment>()) SynModifyAssignment(pos, ctx.Previous(), modifyType, lhs, rhs);
		}

		return lhs;
	}

	return NULL;
}